

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O2

string_view __thiscall
gmlc::utilities::string_viewOps::removeBrackets(string_viewOps *this,string_view str)

{
  byte bVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  string_view trimCharacters;
  string_view input;
  string_view ret;
  byte *pbVar4;
  
  input._M_str = (char *)str._M_len;
  trimCharacters._M_str = " \t\n\r";
  trimCharacters._M_len = 4;
  input._M_len = (size_t)this;
  ret = trim(input,trimCharacters);
  pbVar4 = (byte *)ret._M_str;
  sVar3 = ret._M_len;
  if (sVar3 == 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pbVar4;
    ret = (string_view)(auVar2 << 0x40);
  }
  else {
    bVar1 = *pbVar4;
    if ((((bVar1 - 0x3c < 0x40) &&
         ((0x8000000080000001U >> ((ulong)(bVar1 - 0x3c) & 0x3f) & 1) != 0)) || (bVar1 == 0x28)) &&
       (pbVar4[sVar3 - 1] == pmap[bVar1])) {
      ret = (string_view)
            std::basic_string_view<char,_std::char_traits<char>_>::substr(&ret,1,sVar3 - 2);
    }
  }
  return ret;
}

Assistant:

std::string_view removeBrackets(std::string_view str)
{
    std::string_view ret = trim(str);
    if (!ret.empty()) {
        if ((ret.front() == '[') || (ret.front() == '(') ||
            (ret.front() == '{') || (ret.front() == '<')) {
            if (static_cast<unsigned char>(ret.back()) == pmap[ret.front()]) {
                return ret.substr(1, ret.size() - 2);
            }
        }
    }
    return ret;
}